

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  buffer<char> *pbVar11;
  uint *divisor;
  int iVar12;
  result rVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  size_t __len;
  uint64_t uVar21;
  int iVar22;
  char cVar24;
  ulong uVar25;
  ulong uVar26;
  uint64_t uVar27;
  int iVar28;
  boundaries bVar29;
  int exp;
  fixed_handler handler;
  int local_94;
  buffer<char> *local_90;
  ulong local_88;
  uint64_t local_80;
  uint *local_78;
  fixed_handler local_70;
  double local_58;
  fp local_50;
  float_specs local_40;
  ulong local_38;
  uint *puVar23;
  
  uVar14 = (ulong)(uint)precision;
  uVar26 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar26 == 0x200000000) {
      if (buf->capacity_ < uVar14) {
        (**buf->_vptr_buffer)(buf,uVar14);
      }
      buf->size_ = uVar14;
      memset(buf->ptr_,0x30,uVar14);
      return -precision;
    }
    if (buf->capacity_ < buf->size_ + 1) {
      (**buf->_vptr_buffer)(buf);
    }
    sVar1 = buf->size_;
    buf->size_ = sVar1 + 1;
    buf->ptr_[sVar1] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_94 = 0;
  local_90 = buf;
  local_58 = value;
  if (precision < 0) {
    local_50.f = 0;
    local_50.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      bVar29 = fp::assign_with_boundaries<double>(&local_50,value);
    }
    else {
      bVar29 = fp::assign_float_with_boundaries<double>(&local_50,value);
    }
    if ((local_50.f & 0x10000000000000) == 0) {
      lVar19 = 0x3f;
      if ((local_50.f & 0xfffffffffffff) != 0) {
        for (; (local_50.f & 0xfffffffffffff) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      local_50.f = local_50.f << (~(byte)lVar19 + 0x35 & 0x3f);
      local_50.e = (local_50.e - ((uint)lVar19 ^ 0x3f)) + 0xb;
    }
    iVar12 = (int)((ulong)((long)(-0x32 - local_50.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar16 = iVar12 + 0x15b;
    uVar18 = iVar12 + 0x162;
    if (-1 < (int)uVar16) {
      uVar18 = uVar16;
    }
    uVar14 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar18 >> 3) * 8 + 8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar14;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_50.f << 0xb;
    local_50.f = SUB168(auVar4 * auVar8,8) - (SUB168(auVar4 * auVar8,0) >> 0x3f);
    cVar24 = (char)local_50.e;
    local_50.e = local_50.e +
                 *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
                 0x35;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar14;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = bVar29.lower;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = bVar29.upper;
    lVar20 = SUB168(auVar6 * auVar10,8);
    lVar19 = -(SUB168(auVar6 * auVar10,0) >> 0x3f);
    uVar26 = lVar20 + lVar19 + 1;
    local_70.buf = buf->ptr_;
    local_70.size = 0;
    local_70._16_8_ = uVar26 - local_50.f;
    bVar15 = -(cVar24 + (char)*(short *)(basic_data<void>::pow10_exponents +
                                        (long)((int)uVar18 >> 3) * 2 + 2)) - 0x35;
    local_78 = (uint *)(1L << (bVar15 & 0x3f));
    uVar14 = uVar26 >> (bVar15 & 0x3f);
    local_80 = (long)local_78 - 1;
    local_94 = 1;
    uVar16 = (uint)uVar14;
    if (((((9 < uVar16) && (local_94 = 2, 99 < uVar16)) && (local_94 = 3, 999 < uVar16)) &&
        ((local_94 = 4, 9999 < uVar16 && (local_94 = 5, 99999 < uVar16)))) &&
       ((local_94 = 6, 999999 < uVar16 &&
        ((local_94 = 7, 9999999 < uVar16 && (local_94 = 8, 99999999 < uVar16)))))) {
      local_94 = 10 - (uint)(uVar16 < 1000000000);
    }
    uVar17 = (ulong)((uVar18 & 0xfffffff8) + 8);
    uVar27 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar20 + lVar19 + 2
    ;
    uVar26 = uVar26 & local_80;
    local_88 = uVar17;
    do {
      lVar19 = (long)local_94;
      switch(local_94) {
      case 1:
        cVar24 = (char)uVar14;
        uVar14 = 0;
        goto LAB_00171309;
      case 2:
        cVar24 = (char)((uVar14 & 0xffffffff) / 10);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10) * 10;
        break;
      case 3:
        cVar24 = (char)((uVar14 & 0xffffffff) / 100);
        iVar12 = (int)((uVar14 & 0xffffffff) / 100) * 100;
        break;
      case 4:
        cVar24 = (char)((uVar14 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 1000) * 1000;
        break;
      case 5:
        cVar24 = (char)((uVar14 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10000) * 10000;
        break;
      case 6:
        uVar25 = uVar14 >> 5 & 0x7ffffff;
        cVar24 = (char)(uVar25 / 0xc35);
        iVar12 = (int)(uVar25 / 0xc35) * 100000;
        break;
      case 7:
        cVar24 = (char)((uVar14 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 8:
        cVar24 = (char)((uVar14 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 9:
        cVar24 = (char)((uVar14 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 10:
        uVar25 = (uVar14 >> 9 & 0x7fffff) * 0x44b83;
        cVar24 = (char)(uVar25 >> 0x27);
        iVar12 = (uint)(uVar25 >> 0x27) * 1000000000;
        break;
      default:
        cVar24 = '\0';
        goto LAB_00171309;
      }
      uVar14 = (ulong)(uint)((int)uVar14 - iVar12);
LAB_00171309:
      local_94 = local_94 + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_70,cVar24 + '0',
                          *(long *)(
                                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                   + lVar19 * 8 + 0x18) << (bVar15 & 0x3f),
                          ((uVar14 & 0xffffffff) << (bVar15 & 0x3f)) + uVar26,uVar27,local_94,true);
      divisor = local_78;
      uVar21 = local_80;
      if (rVar13 != more) {
        uVar17 = (ulong)rVar13;
      }
      iVar12 = (int)uVar17;
      puVar23 = &switchD_0017122d::switchdataD_0018d308;
      if (rVar13 != more) goto LAB_001713ba;
    } while (0 < local_94);
    do {
      uVar14 = uVar26 * 10;
      uVar27 = uVar27 * 10;
      uVar26 = uVar14 & uVar21;
      local_94 = local_94 + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_70,
                          (char)(uVar14 >> (bVar15 & 0x3f)) + '0',(uint64_t)divisor,uVar26,uVar27,
                          local_94,false);
      if (rVar13 != more) {
        uVar17 = (ulong)rVar13;
      }
      iVar12 = (int)uVar17;
      puVar23 = divisor;
    } while (rVar13 == more);
LAB_001713ba:
    pbVar11 = local_90;
    iVar22 = (int)puVar23;
    uVar14 = (ulong)(uint)local_70.size;
    iVar28 = (int)local_88;
    if (iVar12 == 2) {
      local_94 = local_94 + (local_70.size - iVar28) + 0x15b;
      fallback_format<double>(local_58,local_90,&local_94);
      iVar22 = local_94;
    }
    else {
      if (local_90->capacity_ < uVar14) {
        (**local_90->_vptr_buffer)(local_90,uVar14);
      }
      pbVar11->size_ = uVar14;
    }
    if (iVar12 == 2) {
      return iVar22;
    }
  }
  else {
    if (0x11 < precision) {
      iVar12 = snprintf_float<double>(value,precision,specs,buf);
      return iVar12;
    }
    uVar17 = (ulong)value & 0xfffffffffffff;
    uVar18 = (uint)((ulong)value >> 0x34) & 0x7ff;
    uVar14 = uVar17 + 0x10000000000000;
    if (uVar18 == 0) {
      uVar14 = uVar17;
    }
    iVar12 = uVar18 - 0x433;
    if (uVar18 == 0) {
      lVar19 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      uVar14 = uVar14 << (~(byte)lVar19 + 0x35 & 0x3f);
      iVar12 = -0x427 - ((uint)lVar19 ^ 0x3f);
    }
    iVar22 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar16 = iVar22 + 0x15b;
    uVar18 = iVar22 + 0x162;
    if (-1 < (int)uVar16) {
      uVar18 = uVar16;
    }
    local_88 = (ulong)(uVar18 & 0xfffffff8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar14 << 0xb;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                             (long)((int)uVar18 >> 3) * 8 + 8);
    uVar17 = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar16 = -(*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
              iVar12) - 0x35;
    local_70.buf = buf->ptr_;
    local_70.size = 0;
    bVar15 = (byte)uVar16;
    local_80 = 1L << (bVar15 & 0x3f);
    uVar14 = uVar17 >> (bVar15 & 0x3f);
    local_70.fixed = uVar26 == 0x200000000;
    local_70.exp10 = 0x154 - (uVar18 & 0xfffffff8);
    local_94 = 1;
    uVar18 = (uint)uVar14;
    if ((((9 < uVar18) && (local_94 = 2, 99 < uVar18)) && (local_94 = 3, 999 < uVar18)) &&
       (((local_94 = 4, 9999 < uVar18 && (local_94 = 5, 99999 < uVar18)) &&
        ((local_94 = 6, 999999 < uVar18 &&
         ((local_94 = 7, 9999999 < uVar18 && (local_94 = 8, 99999999 < uVar18)))))))) {
      local_94 = 10 - (uint)(uVar18 < 1000000000);
    }
    local_70.precision = precision;
    local_40 = specs;
    rVar13 = fixed_handler::on_start
                       (&local_70,
                        (&basic_data<void>::powers_of_10_64)[local_94 - 1] << (bVar15 & 0x3f),
                        uVar17 / 10,10,&local_94);
    if (rVar13 == more) {
      local_78 = (uint *)(local_80 - 1);
      uVar17 = uVar17 & (ulong)local_78;
      do {
        lVar19 = (long)local_94;
        switch(local_94) {
        case 1:
          cVar24 = (char)uVar14;
          uVar14 = 0;
          goto LAB_00170f6c;
        case 2:
          cVar24 = (char)((uVar14 & 0xffffffff) / 10);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10) * 10;
          break;
        case 3:
          cVar24 = (char)((uVar14 & 0xffffffff) / 100);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100) * 100;
          break;
        case 4:
          cVar24 = (char)((uVar14 & 0xffffffff) / 1000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000) * 1000;
          break;
        case 5:
          cVar24 = (char)((uVar14 & 0xffffffff) / 10000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000) * 10000;
          break;
        case 6:
          uVar25 = uVar14 >> 5 & 0x7ffffff;
          cVar24 = (char)(uVar25 / 0xc35);
          iVar12 = (int)(uVar25 / 0xc35) * 100000;
          break;
        case 7:
          cVar24 = (char)((uVar14 & 0xffffffff) / 1000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000000) * 1000000;
          break;
        case 8:
          cVar24 = (char)((uVar14 & 0xffffffff) / 10000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000000) * 10000000;
          break;
        case 9:
          cVar24 = (char)((uVar14 & 0xffffffff) / 100000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100000000) * 100000000;
          break;
        case 10:
          uVar25 = (uVar14 >> 9 & 0x7fffff) * 0x44b83;
          cVar24 = (char)(uVar25 >> 0x27);
          iVar12 = (uint)(uVar25 >> 0x27) * 1000000000;
          break;
        default:
          cVar24 = '\0';
          goto LAB_00170f6c;
        }
        uVar14 = (ulong)(uint)((int)uVar14 - iVar12);
LAB_00170f6c:
        local_94 = local_94 + -1;
        rVar13 = fixed_handler::on_digit
                           (&local_70,cVar24 + '0',
                            *(long *)(
                                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                     + lVar19 * 8 + 0x18) << (bVar15 & 0x3f),
                            ((uVar14 & 0xffffffff) << (bVar15 & 0x3f)) + uVar17,1,local_94,true);
        uVar27 = local_80;
        if (rVar13 != more) goto LAB_00171029;
      } while (0 < local_94);
      uVar21 = 1;
      local_38 = (ulong)uVar16;
      do {
        uVar14 = uVar17 * 10;
        uVar21 = uVar21 * 10;
        uVar17 = uVar14 & (ulong)local_78;
        local_94 = local_94 + -1;
        rVar13 = fixed_handler::on_digit
                           (&local_70,(char)(uVar14 >> ((byte)local_38 & 0x3f)) + '0',uVar27,uVar17,
                            uVar21,local_94,false);
      } while (rVar13 == more);
    }
LAB_00171029:
    pbVar11 = local_90;
    if (rVar13 == error) {
      precision = snprintf_float<double>(local_58,precision,local_40,local_90);
    }
    else {
      uVar14 = (ulong)(uint)local_70.size;
      if (0 < local_70.size && uVar26 != 0x200000000) {
        uVar14 = (ulong)(uint)local_70.size;
        do {
          iVar12 = local_94 + 1;
          if (local_90->ptr_[uVar14 - 1] != '0') goto LAB_00171467;
          bVar2 = 1 < (long)uVar14;
          uVar14 = uVar14 - 1;
          local_94 = iVar12;
        } while (bVar2);
        uVar14 = 0;
      }
LAB_00171467:
      uVar14 = uVar14 & 0xffffffff;
      if (local_90->capacity_ < uVar14) {
        (**local_90->_vptr_buffer)(local_90,uVar14);
      }
      pbVar11->size_ = uVar14;
    }
    if (rVar13 == error) {
      return precision;
    }
    iVar28 = (int)local_88 + 8;
  }
  return (local_94 - iVar28) + 0x15c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}